

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkobj.c
# Opt level: O3

void dealloc_obj(obj *obj)

{
  boolean bVar1;
  
  if ((int)obj->where != 0) {
    panic("dealloc_obj: obj not free (%d,%d,%d)",(ulong)(uint)(int)obj->where,
          (ulong)(uint)(int)obj->otyp,(ulong)(uint)(int)obj->invlet);
  }
  if (obj->timed != '\0') {
    obj_stop_timers(obj);
  }
  bVar1 = obj_sheds_light(obj);
  if (bVar1 != '\0') {
    del_light_source(obj->olev,0,obj);
  }
  if (thrownobj == obj) {
    thrownobj = (obj *)0x0;
  }
  free(obj);
  return;
}

Assistant:

void dealloc_obj(struct obj *obj)
{
    if (obj->where != OBJ_FREE) {
	panic("dealloc_obj: obj not free (%d,%d,%d)",
	      obj->where, obj->otyp, obj->invlet);
    }

    /* free up any timers attached to the object */
    if (obj->timed)
	obj_stop_timers(obj);

    /*
     * Free up any light sources attached to the object.
     *
     * We may want to just call del_light_source() without any
     * checks (requires a code change there).  Otherwise this
     * list must track all objects that can have a light source
     * attached to it (and also requires lamplit to be set).
     */
    if (obj_sheds_light(obj))
	del_light_source(obj->olev, LS_OBJECT, obj);

    if (obj == thrownobj) thrownobj = NULL;

    free(obj);
}